

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uint128.cpp
# Opt level: O2

void __thiscall UInt128_Gt_Test::UInt128_Gt_Test(UInt128_Gt_Test *this)

{
  anon_unknown.dwarf_16de34::UInt128::UInt128(&this->super_UInt128);
  (this->super_UInt128).super_Test._vptr_Test = (_func_int **)&PTR__Test_002148d0;
  return;
}

Assistant:

TEST_F (UInt128, Gt) {
    EXPECT_TRUE (pstore::uint128 (0, 1) > pstore::uint128 (0, 0));
    EXPECT_TRUE (pstore::uint128 (0, 1) >= pstore::uint128 (0, 0));
    EXPECT_TRUE (pstore::uint128 (2, 1) > pstore::uint128 (1, 2));
    EXPECT_TRUE (pstore::uint128 (2, 1) >= pstore::uint128 (1, 2));
    EXPECT_TRUE (pstore::uint128 (1, 1) >= pstore::uint128 (1, 1));

    EXPECT_TRUE (pstore::uint128{6U} > 5U);
    EXPECT_TRUE (pstore::uint128{6U} >= 6U);
}